

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3LookasideUsed(sqlite3 *db,int *pHighwater)

{
  u32 uVar1;
  u32 uVar2;
  
  uVar1 = countLookasideSlots((db->lookaside).pInit);
  uVar2 = countLookasideSlots((db->lookaside).pFree);
  if (pHighwater != (int *)0x0) {
    *pHighwater = (db->lookaside).nSlot - uVar1;
  }
  return (db->lookaside).nSlot - (uVar2 + uVar1);
}

Assistant:

SQLITE_PRIVATE int sqlite3LookasideUsed(sqlite3 *db, int *pHighwater){
  u32 nInit = countLookasideSlots(db->lookaside.pInit);
  u32 nFree = countLookasideSlots(db->lookaside.pFree);
  if( pHighwater ) *pHighwater = db->lookaside.nSlot - nInit;
  return db->lookaside.nSlot - (nInit+nFree);
}